

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t * ae_wcstofflags(wchar_t *s,unsigned_long *setp,unsigned_long *clrp)

{
  int iVar1;
  ulong *in_RDX;
  ulong *in_RSI;
  wchar_t *in_RDI;
  bool bVar2;
  wchar_t *failed;
  unsigned_long clear;
  unsigned_long set;
  flag *flag;
  wchar_t *end;
  wchar_t *start;
  wchar_t *local_48;
  ulong local_40;
  ulong local_38;
  flag *local_30;
  wchar_t *local_28;
  wchar_t *local_20;
  
  local_40 = 0;
  local_38 = 0;
  local_48 = (wchar_t *)0x0;
  local_20 = in_RDI;
  while( true ) {
    bVar2 = true;
    if ((*local_20 != L'\t') && (bVar2 = true, *local_20 != L' ')) {
      bVar2 = *local_20 == L',';
    }
    if (!bVar2) break;
    local_20 = local_20 + 1;
  }
  do {
    if (*local_20 == L'\0') {
      if (in_RSI != (ulong *)0x0) {
        *in_RSI = local_38;
      }
      if (in_RDX != (ulong *)0x0) {
        *in_RDX = local_40;
      }
      return local_48;
    }
    local_28 = local_20;
    while( true ) {
      bVar2 = false;
      if (((*local_28 != L'\0') && (bVar2 = false, *local_28 != L'\t')) &&
         (bVar2 = false, *local_28 != L' ')) {
        bVar2 = *local_28 != L',';
      }
      if (!bVar2) break;
      local_28 = local_28 + 1;
    }
    for (local_30 = flags; local_30->wname != (wchar_t *)0x0; local_30 = local_30 + 1) {
      iVar1 = wmemcmp(local_20,local_30->wname,(long)local_28 - (long)local_20 >> 2);
      if (iVar1 == 0) {
        local_40 = local_30->set | local_40;
        local_38 = local_30->clear | local_38;
        break;
      }
      iVar1 = wmemcmp(local_20,local_30->wname + 2,(long)local_28 - (long)local_20 >> 2);
      if (iVar1 == 0) {
        local_38 = local_30->set | local_38;
        local_40 = local_30->clear | local_40;
        break;
      }
    }
    if ((local_30->wname == (wchar_t *)0x0) && (local_48 == (wchar_t *)0x0)) {
      local_48 = local_20;
    }
    local_20 = local_28;
    while( true ) {
      bVar2 = true;
      if ((*local_20 != L'\t') && (bVar2 = true, *local_20 != L' ')) {
        bVar2 = *local_20 == L',';
      }
      if (!bVar2) break;
      local_20 = local_20 + 1;
    }
  } while( true );
}

Assistant:

static const wchar_t *
ae_wcstofflags(const wchar_t *s, unsigned long *setp, unsigned long *clrp)
{
	const wchar_t *start, *end;
	struct flag *flag;
	unsigned long set, clear;
	const wchar_t *failed;

	set = clear = 0;
	start = s;
	failed = NULL;
	/* Find start of first token. */
	while (*start == L'\t'  ||  *start == L' '  ||  *start == L',')
		start++;
	while (*start != L'\0') {
		/* Locate end of token. */
		end = start;
		while (*end != L'\0'  &&  *end != L'\t'  &&
		    *end != L' '  &&  *end != L',')
			end++;
		for (flag = flags; flag->wname != NULL; flag++) {
			if (wmemcmp(start, flag->wname, end - start) == 0) {
				/* Matched "noXXXX", so reverse the sense. */
				clear |= flag->set;
				set |= flag->clear;
				break;
			} else if (wmemcmp(start, flag->wname + 2, end - start)
			    == 0) {
				/* Matched "XXXX", so don't reverse. */
				set |= flag->set;
				clear |= flag->clear;
				break;
			}
		}
		/* Ignore unknown flag names. */
		if (flag->wname == NULL  &&  failed == NULL)
			failed = start;

		/* Find start of next token. */
		start = end;
		while (*start == L'\t'  ||  *start == L' '  ||  *start == L',')
			start++;

	}

	if (setp)
		*setp = set;
	if (clrp)
		*clrp = clear;

	/* Return location of first failure. */
	return (failed);
}